

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIChain.cpp
# Opt level: O2

ExchangeAbsolutePositionRequests __thiscall
adios2::aggregator::MPIChain::IExchangeAbsolutePosition(MPIChain *this,Buffer *buffer,int step)

{
  int iVar1;
  long lVar2;
  int in_ECX;
  undefined4 in_register_00000014;
  unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  extraout_RDX;
  tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  extraout_RDX_00;
  __uniq_ptr_data<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>,_true,_true>
  extraout_RDX_01;
  __uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  _Var3;
  int tag;
  ExchangeAbsolutePositionRequests EVar4;
  allocator local_b4;
  allocator local_b3;
  allocator local_b2;
  allocator local_b1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  lVar2 = CONCAT44(in_register_00000014,step);
  iVar1 = *(int *)((long)&buffer->m_FixedSize + 4);
  if (iVar1 == 1) {
    helper::Comm::Req::Req((Req *)this);
    helper::Comm::Req::Req((Req *)&(this->super_MPIAggregator).m_SubStreams);
    _Var3._M_t.
    super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
    .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl =
         (tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>)
         (tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>)
         extraout_RDX._M_t.
         super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
         .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
    goto LAB_00602495;
  }
  if ((char)buffer[1].m_Type._M_string_length == '\x01') {
    std::__cxx11::string::string((string *)&local_50,"Toolkit",&local_b1);
    std::__cxx11::string::string((string *)&local_70,"aggregator::mpi::MPIChain",&local_b2);
    std::__cxx11::string::string((string *)&local_90,"IExchangeAbsolutePosition",&local_b3);
    std::__cxx11::string::string
              ((string *)&local_b0,"An existing exchange is still active",&local_b4);
    helper::Throw<std::runtime_error>(&local_50,&local_70,&local_90,&local_b0,-1);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    iVar1 = *(int *)((long)&buffer->m_FixedSize + 4);
  }
  tag = 0;
  if (iVar1 + -1 != in_ECX) {
    tag = in_ECX + 1;
  }
  ExchangeAbsolutePositionRequests::ExchangeAbsolutePositionRequests
            ((ExchangeAbsolutePositionRequests *)this);
  iVar1 = (int)buffer->m_FixedSize;
  if (in_ECX == 0) {
    buffer[1].m_Type.field_2._M_allocated_capacity =
         *(size_type *)(lVar2 + 0x30 + (ulong)(iVar1 == 0) * 8);
  }
  if (iVar1 == in_ECX) {
    if (in_ECX == 0) {
      lVar2 = 0;
    }
    else {
      lVar2 = *(long *)(lVar2 + 0x38);
    }
    *(size_type *)((long)&buffer[1].m_Type.field_2 + 8) =
         lVar2 + buffer[1].m_Type.field_2._M_allocated_capacity;
    std::__cxx11::to_string(&local_90,in_ECX);
    std::operator+(&local_70,", aggregation Isend absolute position at iteration ",&local_90);
    std::operator+(&local_50,&local_70,"\n");
    helper::Comm::Isend<unsigned_long>
              ((Comm *)&local_b0,(unsigned_long *)((buffer->m_Type).field_2._M_local_buf + 8),
               (size_t)((long)&buffer[1].m_Type.field_2 + 8),1,tag,(string *)0x0);
    helper::Comm::Req::operator=((Req *)this,(Req *)&local_b0);
LAB_00602468:
    helper::Comm::Req::~Req((Req *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    _Var3._M_t.
    super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
    .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl =
         (tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>)
         (tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>)
         extraout_RDX_01.
         super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
         .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
  }
  else {
    _Var3._M_t.
    super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
    .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl =
         (tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>)
         (tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>)
         extraout_RDX_00.
         super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
         .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
    if (iVar1 == tag) {
      std::__cxx11::to_string(&local_90,in_ECX);
      std::operator+(&local_70,", aggregation Irecv absolute position at iteration ",&local_90);
      std::operator+(&local_50,&local_70,"\n");
      helper::Comm::Irecv<unsigned_long>
                ((Comm *)&local_b0,(unsigned_long *)((buffer->m_Type).field_2._M_local_buf + 8),
                 lVar2 + 0x38,1,in_ECX,(string *)0x0);
      helper::Comm::Req::operator=
                ((Req *)&(this->super_MPIAggregator).m_SubStreams,(Req *)&local_b0);
      goto LAB_00602468;
    }
  }
  *(undefined1 *)&buffer[1].m_Type._M_string_length = 1;
LAB_00602495:
  EVar4.m_Recv.m_Impl._M_t.
  super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl =
       (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>)
       (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>)
       _Var3._M_t.
       super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
       .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
  EVar4.m_Send.m_Impl._M_t.
  super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl =
       (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>)
       (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>)
       this;
  return EVar4;
}

Assistant:

MPIChain::ExchangeAbsolutePositionRequests
MPIChain::IExchangeAbsolutePosition(format::Buffer &buffer, const int step)
{
    if (m_Size == 1)
    {
        return {};
    }

    if (m_IsInExchangeAbsolutePosition)
    {
        helper::Throw<std::runtime_error>("Toolkit", "aggregator::mpi::MPIChain",
                                          "IExchangeAbsolutePosition",
                                          "An existing exchange is still active");
    }

    const int destination = (step != m_Size - 1) ? step + 1 : 0;
    ExchangeAbsolutePositionRequests requests;

    if (step == 0)
    {
        m_SizeSend = (m_Rank == 0) ? buffer.m_AbsolutePosition : buffer.m_Position;
    }

    if (m_Rank == step)
    {
        m_ExchangeAbsolutePosition =
            (m_Rank == 0) ? m_SizeSend : m_SizeSend + buffer.m_AbsolutePosition;

        requests.m_Send = m_Comm.Isend(&m_ExchangeAbsolutePosition, 1, destination, 0,
                                       ", aggregation Isend absolute position at iteration " +
                                           std::to_string(step) + "\n");
    }
    else if (m_Rank == destination)
    {
        requests.m_Recv = m_Comm.Irecv(&buffer.m_AbsolutePosition, 1, step, 0,
                                       ", aggregation Irecv absolute position at iteration " +
                                           std::to_string(step) + "\n");
    }

    m_IsInExchangeAbsolutePosition = true;
    return requests;
}